

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O3

void polymul_internal::taylor_inplace_multiplier<double,_4,_5,_5,_3>::mul(double *p1,double *p2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = binomial(8,4);
  iVar2 = binomial(5,1);
  iVar3 = binomial(6,2);
  polynomial_multiplier<double,_3,_2,_3>::mul(p1 + iVar1,p1 + iVar2,p2 + iVar3);
  taylor_inplace_multiplier<double,_4,_5,_5,_4>::mul(p1,p2);
  return;
}

Assistant:

static void mul(numtype p1[], const numtype p2[]) {
    if (i2 <= Ndeg2) {
      // M1(Ndeg-i2)*M2(i2) -> M1(Ndeg)
      polynomial_multiplier<numtype, Nvar - 1, Ndeg - i2, i2>::mul(
          p1 + binomial(Nvar + Ndeg - 1, Ndeg - 1),
          p1 + binomial(Nvar + Ndeg - i2 - 1, Ndeg - i2 - 1),
          p2 + binomial(Nvar + i2 - 1, i2 - 1));
    }
    taylor_inplace_multiplier<numtype, Nvar, Ndeg, Ndeg2, i2 + 1> // Back to (2), or
                                                                  // to (3) when i2+1
                                                                  // == Ndeg
        ::mul(p1, p2);
  }